

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O2

Abc_Ntk_t * Bbl_ManToAbc(Bbl_Man_t *p)

{
  Mem_Flex_t *pMan;
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  char *pcVar3;
  Vec_Ptr_t *p_00;
  Bbl_Obj_t *pBVar4;
  Abc_Obj_t *pAVar5;
  Bbl_Obj_t *p_01;
  Abc_Obj_t *pFanin;
  
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar2 = Bbl_ManName(p);
  pcVar3 = Extra_UtilStrsav(pcVar2);
  pNtk->pName = pcVar3;
  p_00 = Vec_PtrStart((int)pcVar2);
  pBVar4 = Bbl_ManObjFirst(p);
  do {
    if (pBVar4 == (Bbl_Obj_t *)0x0) {
      for (pBVar4 = Bbl_ManObjFirst(p); pBVar4 != (Bbl_Obj_t *)0x0;
          pBVar4 = Bbl_ManObjNext(p,pBVar4)) {
        for (p_01 = Bbl_ObjFaninFirst(pBVar4); p_01 != (Bbl_Obj_t *)0x0;
            p_01 = Bbl_ObjFaninNext(pBVar4,p_01)) {
          iVar1 = Bbl_ObjId(pBVar4);
          pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar1);
          iVar1 = Bbl_ObjId(p_01);
          pFanin = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar1);
          Abc_ObjAddFanin(pAVar5,pFanin);
        }
      }
      Vec_PtrFree(p_00);
      Abc_NtkAddDummyPiNames(pNtk);
      Abc_NtkAddDummyPoNames(pNtk);
      iVar1 = Abc_NtkCheck(pNtk);
      if (iVar1 == 0) {
        puts("Bbl_ManToAbc(): Network check has failed.");
      }
      return pNtk;
    }
    iVar1 = Bbl_ObjIsInput(pBVar4);
    if (iVar1 == 0) {
      iVar1 = Bbl_ObjIsOutput(pBVar4);
      if (iVar1 == 0) {
        iVar1 = Bbl_ObjIsLut(pBVar4);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBblif.c"
                        ,0x4a,"Abc_Ntk_t *Bbl_ManToAbc(Bbl_Man_t *)");
        }
        pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
      }
      else {
        pAVar5 = Abc_NtkCreatePo(pNtk);
      }
    }
    else {
      pAVar5 = Abc_NtkCreatePi(pNtk);
    }
    iVar1 = Bbl_ObjIsLut(pBVar4);
    if (iVar1 != 0) {
      pMan = (Mem_Flex_t *)pNtk->pManFunc;
      pcVar2 = Bbl_ObjSop(p,pBVar4);
      pcVar2 = Abc_SopRegister(pMan,pcVar2);
      (pAVar5->field_5).pData = pcVar2;
    }
    iVar1 = Bbl_ObjId(pBVar4);
    Vec_PtrSetEntry(p_00,iVar1,pAVar5);
    pBVar4 = Bbl_ManObjNext(p,pBVar4);
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


// For description of Binary BLIF format, refer to "abc/src/aig/bbl/bblif.h"

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Fnction*************************************************************

  Synopsis    [Constructs ABC network from the manager.]

  Description [The ABC network is started, as well as the array vCopy,
  which will map the new ID of each object in the BBLIF manager into
  the ponter ot the corresponding object in the ABC. For each internal
  node, determined by Bbl_ObjIsLut(), the SOP representation is created
  by retrieving the SOP representation of the BBLIF object. Finally,
  the objects are connected using fanin/fanout creation, and the dummy
  names are assigned because ABC requires each CI/CO to have a name.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Bbl_ManToAbc( Bbl_Man_t * p )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObjNew = NULL;
    Bbl_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vCopy;
    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtk->pName = Extra_UtilStrsav( Bbl_ManName(p) );
    // create objects
    vCopy = Vec_PtrStart( 1000 );
    Bbl_ManForEachObj( p, pObj )
    {
        if ( Bbl_ObjIsInput(pObj) )
            pObjNew = Abc_NtkCreatePi( pNtk );
        else if ( Bbl_ObjIsOutput(pObj) )
            pObjNew = Abc_NtkCreatePo( pNtk );
        else if ( Bbl_ObjIsLut(pObj) )
            pObjNew = Abc_NtkCreateNode( pNtk );
        else assert( 0 );
        if ( Bbl_ObjIsLut(pObj) )
            pObjNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, Bbl_ObjSop(p, pObj) );
        Vec_PtrSetEntry( vCopy, Bbl_ObjId(pObj), pObjNew );
    }
    // connect objects
    Bbl_ManForEachObj( p, pObj )
        Bbl_ObjForEachFanin( pObj, pFanin )
            Abc_ObjAddFanin( (Abc_Obj_t *)Vec_PtrEntry(vCopy, Bbl_ObjId(pObj)), (Abc_Obj_t *)Vec_PtrEntry(vCopy, Bbl_ObjId(pFanin)) );
    // finalize
    Vec_PtrFree( vCopy );
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    if ( !Abc_NtkCheck( pNtk ) )
        printf( "Bbl_ManToAbc(): Network check has failed.\n" );
    return pNtk;
}